

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash(robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
         *this,size_type count)

{
  ulong count_00;
  float fVar1;
  
  fVar1 = ceilf((float)this->m_nb_elements / this->m_max_load_factor);
  count_00 = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
  if (count_00 <= count) {
    count_00 = count;
  }
  rehash_impl(this,count_00);
  return;
}

Assistant:

void rehash(size_type count) {
        count = std::max(count, size_type(std::ceil(float(size())/max_load_factor())));
        rehash_impl(count);
    }